

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

tuple pybind11::make_tuple<(pybind11::return_value_policy)1,std::__cxx11::string&>
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_)

{
  ulong uVar1;
  bool bVar2;
  handle __val;
  size_type sVar3;
  handle *this;
  undefined8 uVar4;
  PyObject **ppPVar5;
  string *in_RSI;
  object in_RDI;
  value_type *arg_value;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_1UL> *__range2;
  int counter;
  size_t i;
  array<pybind11::object,_1UL> args;
  size_t size;
  tuple *result;
  object *in_stack_fffffffffffffef8;
  array<pybind11::object,_1UL> *in_stack_ffffffffffffff00;
  PyTypeObject *pPVar6;
  handle in_stack_ffffffffffffff08;
  array<pybind11::object,_1UL> *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  return_value_policy in_stack_ffffffffffffff1f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  handle in_stack_ffffffffffffff28;
  handle local_a0;
  iterator local_98;
  iterator local_90;
  iterator local_88;
  array<pybind11::object,_1UL> *local_80;
  int local_78;
  undefined1 local_72;
  undefined1 local_71;
  ulong local_50;
  handle local_38;
  PyObject *local_30;
  array<pybind11::object,_1UL> *local_28;
  array<pybind11::object,_1UL> local_20;
  undefined8 local_18;
  
  local_18 = 1;
  local_28 = &local_20;
  handle::handle<std::nullptr_t,_0>(&local_38,(void *)0x0);
  __val = detail::
          string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
          ::cast(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1f,in_stack_ffffffffffffff28);
  local_30 = __val.m_ptr;
  reinterpret_steal<pybind11::object>(in_stack_ffffffffffffff08);
  local_50 = 0;
  while( true ) {
    uVar1 = local_50;
    sVar3 = std::array<pybind11::object,_1UL>::size(&local_20);
    if (sVar3 <= uVar1) {
      local_72 = 0;
      tuple::tuple<unsigned_long,_0>
                ((tuple *)in_stack_ffffffffffffff20,
                 CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      local_78 = 0;
      local_80 = &local_20;
      local_88 = std::array<pybind11::object,_1UL>::begin((array<pybind11::object,_1UL> *)0x2ec004);
      local_90 = std::array<pybind11::object,_1UL>::end((array<pybind11::object,_1UL> *)0x2ec019);
      for (; local_88 != local_90; local_88 = local_88 + 1) {
        local_98 = local_88;
        local_a0 = object::release(in_stack_fffffffffffffef8);
        ppPVar5 = handle::ptr(&local_a0);
        pPVar6 = (PyTypeObject *)*ppPVar5;
        ppPVar5 = handle::ptr((handle *)in_RDI.super_handle.m_ptr);
        (&(*ppPVar5)[1].ob_type)[local_78] = pPVar6;
        local_78 = local_78 + 1;
      }
      local_72 = 1;
      std::array<pybind11::object,_1UL>::~array(in_stack_ffffffffffffff10);
      return (tuple)in_RDI.super_handle.m_ptr;
    }
    this = &std::array<pybind11::object,_1UL>::operator[]
                      (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8)->super_handle
    ;
    bVar2 = handle::operator_cast_to_bool(this);
    if (!bVar2) break;
    local_50 = local_50 + 1;
  }
  local_71 = 1;
  uVar4 = __cxa_allocate_exception(0x10);
  std::__cxx11::to_string((unsigned_long)__val.m_ptr);
  cast_error_unable_to_convert_call_arg(in_RSI);
  local_71 = 0;
  __cxa_throw(uVar4,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

tuple make_tuple(Args &&...args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args{{reinterpret_steal<object>(
        detail::make_caster<Args>::cast(std::forward<Args>(args_), policy, nullptr))...}};
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if !defined(PYBIND11_DETAILED_ERROR_MESSAGES)
            throw cast_error_unable_to_convert_call_arg(std::to_string(i));
#else
            std::array<std::string, size> argtypes{{type_id<Args>()...}};
            throw cast_error_unable_to_convert_call_arg(std::to_string(i), argtypes[i]);
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args) {
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    }
    return result;
}